

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall
QDomEntityPrivate::save(QDomEntityPrivate *this,QTextStream *s,int param_2,int param_3)

{
  char16_t *pcVar1;
  Data *pDVar2;
  qsizetype qVar3;
  char cVar4;
  QTextStream *pQVar5;
  char16_t *pcVar6;
  storage_type *psVar7;
  int iVar8;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QStringBuilder<QString,_QString> local_a8;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  ulong uVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (this->super_QDomNodePrivate).name.d.d;
  local_58.ptr = (this->super_QDomNodePrivate).name.d.ptr;
  local_58.size = (this->super_QDomNodePrivate).name.d.size;
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  cVar4 = QString::startsWith((QChar)(char16_t)&local_58,0x25);
  if (cVar4 != '\0') {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_c0,L"% ",2);
    QString::mid((longlong)&local_d8,(longlong)&local_58);
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_a8,(QString *)&local_c0,(QString *)&local_d8);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_78,&local_a8);
    qVar3 = local_58.size;
    pcVar6 = local_58.ptr;
    pDVar2 = local_58.d;
    local_58.d = local_78.d;
    local_58.ptr = local_78.ptr;
    local_78.d = pDVar2;
    local_78.ptr = pcVar6;
    local_58.size = local_78.size;
    local_78.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  }
  pcVar6 = (this->m_pub).d.ptr;
  pcVar1 = (this->m_sys).d.ptr;
  pQVar5 = (QTextStream *)QTextStream::operator<<(s,"<!ENTITY ");
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_58);
  if (pcVar1 == (char16_t *)0x0 && pcVar6 == (char16_t *)0x0) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," \"");
    QString::toUtf8_helper((QString *)&local_78);
    local_a8.a.d.d = local_78.d;
    local_a8.a.d.ptr = local_78.ptr;
    local_a8.a.d.size = local_78.size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pcVar6 = local_78.ptr;
    if (local_78.ptr == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QByteArray::_empty;
    }
    uVar9 = 0;
    uVar11 = local_78.size;
    while( true ) {
      iVar8 = (int)uVar9;
      iVar10 = (int)uVar11;
      if (iVar10 <= iVar8) break;
      lVar12 = (long)iVar8;
      cVar4 = *(char *)((long)pcVar6 + lVar12);
      if (cVar4 == '&') {
        uVar9 = lVar12 + 1;
        if (((int)uVar9 < iVar10) && (*(char *)((long)pcVar6 + uVar9) == '#')) {
          psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("&#38;",6);
          QVar13.m_data = psVar7;
          QVar13.m_size = 1;
          QByteArray::replace((longlong)&local_a8,lVar12,QVar13);
          pcVar6 = local_a8.a.d.ptr;
          if (local_a8.a.d.ptr == (char16_t *)0x0) {
            pcVar6 = (char16_t *)&QByteArray::_empty;
          }
LAB_001138ee:
          uVar9 = (ulong)(iVar8 + 5);
          uVar11 = (ulong)(iVar10 + 4);
        }
      }
      else {
        if (cVar4 == '\"') {
          psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("&#34;",6);
          QVar15.m_data = psVar7;
          QVar15.m_size = 1;
          QByteArray::replace((longlong)&local_a8,lVar12,QVar15);
          pcVar6 = local_a8.a.d.ptr;
          if (local_a8.a.d.ptr == (char16_t *)0x0) {
            pcVar6 = (char16_t *)&QByteArray::_empty;
          }
          goto LAB_001138ee;
        }
        if (cVar4 == '%') {
          psVar7 = (storage_type *)QByteArrayView::lengthHelperCharArray("&#60;",6);
          QVar14.m_data = psVar7;
          QVar14.m_size = 1;
          QByteArray::replace((longlong)&local_a8,lVar12,QVar14);
          pcVar6 = local_a8.a.d.ptr;
          if (local_a8.a.d.ptr == (char16_t *)0x0) {
            pcVar6 = (char16_t *)&QByteArray::_empty;
          }
          goto LAB_001138ee;
        }
        uVar9 = (ulong)(iVar8 + 1);
      }
    }
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QByteArray *)&local_a8);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"\">");
    Qt::endl(pQVar5);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  }
  else {
    QTextStream::operator<<(pQVar5,' ');
    if ((this->m_pub).d.ptr == (char16_t *)0x0) {
      pQVar5 = (QTextStream *)QTextStream::operator<<(s,"SYSTEM ");
      quotedValue(&local_a8.a,&this->m_sys);
      QTextStream::operator<<(pQVar5,&local_a8.a);
    }
    else {
      pQVar5 = (QTextStream *)QTextStream::operator<<(s,"PUBLIC ");
      quotedValue(&local_a8.a,&this->m_pub);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,&local_a8.a);
      pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,' ');
      quotedValue((QString *)&local_78,&this->m_sys);
      QTextStream::operator<<(pQVar5,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    if ((this->m_notationName).d.ptr != (char16_t *)0x0) {
      pQVar5 = (QTextStream *)QTextStream::operator<<(s," NDATA ");
      QTextStream::operator<<(pQVar5,&this->m_notationName);
    }
    pQVar5 = (QTextStream *)QTextStream::operator<<(s,'>');
    Qt::endl(pQVar5);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomEntityPrivate::save(QTextStream& s, int, int) const
{
    QString _name = name;
    if (_name.startsWith(u'%'))
        _name = u"% "_s + _name.mid(1);

    if (m_sys.isNull() && m_pub.isNull()) {
        s << "<!ENTITY " << _name << " \"" << encodeEntity(value.toUtf8()) << "\">" << Qt::endl;
    } else {
        s << "<!ENTITY " << _name << ' ';
        if (m_pub.isNull()) {
            s << "SYSTEM " << quotedValue(m_sys);
        } else {
            s << "PUBLIC " << quotedValue(m_pub) << ' ' << quotedValue(m_sys);
        }
        if (! m_notationName.isNull()) {
            s << " NDATA " << m_notationName;
        }
        s << '>' << Qt::endl;
    }
}